

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O1

bool __thiscall trun::TestFunc::ShouldExecuteNoDeps(TestFunc *this)

{
  undefined1 uVar1;
  bool bVar2;
  Config *pCVar3;
  
  if (this->state == Idle) {
    if ((this->testScope & ~kGlobal) != kModuleMain) {
      pCVar3 = Config::Instance();
      bVar2 = caseMatch(&this->caseName,&pCVar3->testcases);
      return bVar2;
    }
    pCVar3 = Config::Instance();
    uVar1 = pCVar3->testModuleGlobals;
  }
  else {
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

bool TestFunc::ShouldExecuteNoDeps() {
    // Unless Idle - the rest doesn't matter...
    if (State() != kState::Idle) {
        return false;
    }
    if ((testScope == kTestScope::kModuleMain) || (testScope == kTestScope::kModuleExit)) {
        return Config::Instance().testModuleGlobals;
    }

    return caseMatch(caseName, Config::Instance().testcases);
}